

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_0::TimestampTestInstance::TimestampTestInstance
          (TimestampTestInstance *this,Context *context,StageFlagVector *stages,bool inRenderPass)

{
  Move<vk::Handle<(vk::HandleType)6>_> *pMVar1;
  Move<vk::Handle<(vk::HandleType)24>_> *pMVar2;
  Move<vk::Handle<(vk::HandleType)11>_> *pMVar3;
  Move<vk::VkCommandBuffer_s_*> *this_00;
  deUint32 queueFamilyIndex;
  DeviceInterface *vk;
  VkDevice device;
  InstanceInterface *vk_00;
  VkPhysicalDevice physicalDevice;
  ulong uVar4;
  deUint64 *pdVar5;
  NotSupportedError *this_01;
  ulong uVar6;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> queueProperties;
  string local_98;
  Move<vk::Handle<(vk::HandleType)6>_> *local_78;
  Move<vk::Handle<(vk::HandleType)24>_> *local_70;
  Move<vk::Handle<(vk::HandleType)11>_> *local_68;
  Move<vk::VkCommandBuffer_s_*> *local_60;
  VkFenceCreateInfo fenceParams;
  VkAllocationCallbacks *pVStack_40;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__TimestampTestInstance_00bcc630
  ;
  std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::vector
            (&this->m_stages,stages);
  this->m_inRenderPass = inRenderPass;
  local_70 = &this->m_cmdPool;
  local_60 = &this->m_cmdBuffer;
  local_78 = &this->m_fence;
  local_68 = &this->m_queryPool;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)0x0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device = (VkDevice)0x0
  ;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal = 0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = 0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_queryPool).super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal = 0;
  (this->m_queryPool).super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_queryPool).super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_queryPool).super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  vk_00 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physicalDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceQueueFamilyProperties(&queueProperties,vk_00,physicalDevice);
  if (queueProperties.
      super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
      _M_impl.super__Vector_impl_data._M_start[queueFamilyIndex].timestampValidBits != 0) {
    std::_Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::
    ~_Vector_base(&queueProperties.
                   super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                 );
    queueProperties.
    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x200000000;
    queueProperties.
    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0xb;
    queueProperties.
    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ::vk::createQueryPool
              ((Move<vk::Handle<(vk::HandleType)11>_> *)&fenceParams,vk,device,
               (VkQueryPoolCreateInfo *)&queueProperties,(VkAllocationCallbacks *)0x0);
    this_00 = local_60;
    pMVar3 = local_68;
    local_98.field_2._M_allocated_capacity = fenceParams._16_8_;
    local_98.field_2._8_8_ = pVStack_40;
    local_98._M_dataplus._M_p = (pointer)fenceParams._0_8_;
    local_98._M_string_length = (size_type)fenceParams.pNext;
    fenceParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    fenceParams._4_4_ = 0;
    fenceParams.pNext = (void *)0x0;
    fenceParams.flags = 0;
    fenceParams._20_4_ = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::reset
              (&local_68->super_RefBase<vk::Handle<(vk::HandleType)11>_>);
    (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)11>_>).m_data.deleter.m_device =
         (VkDevice)local_98.field_2._M_allocated_capacity;
    (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)11>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)local_98.field_2._8_8_;
    (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)11>_>).m_data.object.m_internal =
         (deUint64)local_98._M_dataplus._M_p;
    (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)11>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_98._M_string_length;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)11>_> *)&fenceParams);
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)&queueProperties,vk,device,1,
               queueFamilyIndex,(VkAllocationCallbacks *)0x0);
    pMVar2 = local_70;
    local_98.field_2._M_allocated_capacity =
         (size_type)
         queueProperties.
         super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98.field_2._8_8_ = (VkAllocationCallbacks *)0x8;
    local_98._M_dataplus._M_p =
         (pointer)queueProperties.
                  super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_98._M_string_length =
         (size_type)
         queueProperties.
         super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    queueProperties.
    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    queueProperties.
    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    queueProperties.
    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::reset
              (&local_70->super_RefBase<vk::Handle<(vk::HandleType)24>_>);
    (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.deleter.m_device =
         (VkDevice)local_98.field_2._M_allocated_capacity;
    (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)local_98.field_2._8_8_;
    (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal =
         (deUint64)local_98._M_dataplus._M_p;
    (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_98._M_string_length;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&queueProperties);
    ::vk::allocateCommandBuffer
              ((Move<vk::VkCommandBuffer_s_*> *)&queueProperties,vk,device,
               (VkCommandPool)
               (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal,
               VK_COMMAND_BUFFER_LEVEL_PRIMARY);
    local_98.field_2._M_allocated_capacity =
         (size_type)
         queueProperties.
         super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98.field_2._8_8_ = 0;
    local_98._M_dataplus._M_p =
         (pointer)queueProperties.
                  super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_98._M_string_length =
         (size_type)
         queueProperties.
         super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    queueProperties.
    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    queueProperties.
    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    queueProperties.
    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::reset
              (&this_00->super_RefBase<vk::VkCommandBuffer_s_*>);
    (this_00->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_device =
         (VkDevice)local_98.field_2._M_allocated_capacity;
    (this_00->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_pool.m_internal =
         local_98.field_2._8_8_;
    (this_00->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object =
         (VkCommandBuffer_s *)local_98._M_dataplus._M_p;
    (this_00->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_98._M_string_length;
    ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
              ((RefBase<vk::VkCommandBuffer_s_*> *)&queueProperties);
    fenceParams.flags = 0;
    fenceParams._20_4_ = 0;
    fenceParams.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
    fenceParams._4_4_ = 0;
    fenceParams.pNext = (void *)0x0;
    ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&queueProperties,vk,device,
                      &fenceParams,(VkAllocationCallbacks *)0x0);
    pMVar1 = local_78;
    local_98.field_2._M_allocated_capacity =
         (size_type)
         queueProperties.
         super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98.field_2._8_8_ = (VkAllocationCallbacks *)0x0;
    local_98._M_dataplus._M_p =
         (pointer)queueProperties.
                  super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_98._M_string_length =
         (size_type)
         queueProperties.
         super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    queueProperties.
    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    queueProperties.
    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    queueProperties.
    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::reset
              (&local_78->super_RefBase<vk::Handle<(vk::HandleType)6>_>);
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.deleter.m_device =
         (VkDevice)local_98.field_2._M_allocated_capacity;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)local_98.field_2._8_8_;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.object.m_internal =
         (deUint64)local_98._M_dataplus._M_p;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_98._M_string_length;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&queueProperties);
    uVar4 = (long)(this->m_stages).
                  super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_stages).
                  super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = 0xffffffffffffffff;
    if (uVar4 < 0x7ffffffffffffffd) {
      uVar6 = uVar4 * 2;
    }
    pdVar5 = (deUint64 *)operator_new__(uVar6);
    this->m_timestampValues = pdVar5;
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Universal queue does not support timestamps",
             (allocator<char> *)&fenceParams);
  tcu::NotSupportedError::NotSupportedError(this_01,&local_98);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TimestampTestInstance::TimestampTestInstance(Context&                context,
											 const StageFlagVector&  stages,
											 const bool              inRenderPass)
	: TestInstance  (context)
	, m_stages      (stages)
	, m_inRenderPass(inRenderPass)
{
	const DeviceInterface&      vk                  = context.getDeviceInterface();
	const VkDevice              vkDevice            = context.getDevice();
	const deUint32              queueFamilyIndex    = context.getUniversalQueueFamilyIndex();

	// Check support for timestamp queries
	{
		const std::vector<VkQueueFamilyProperties>   queueProperties = vk::getPhysicalDeviceQueueFamilyProperties(m_context.getInstanceInterface(), m_context.getPhysicalDevice());

		DE_ASSERT(queueFamilyIndex < (deUint32)queueProperties.size());

		if (!queueProperties[queueFamilyIndex].timestampValidBits)
			throw tcu::NotSupportedError("Universal queue does not support timestamps");
	}

	// Create Query Pool
	{
		const VkQueryPoolCreateInfo queryPoolParams =
		{
		   VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO,    // VkStructureType               sType;
		   DE_NULL,                                     // const void*                   pNext;
		   0u,                                          // VkQueryPoolCreateFlags        flags;
		   VK_QUERY_TYPE_TIMESTAMP,                     // VkQueryType                   queryType;
		   TimestampTest::ENTRY_COUNT,                  // deUint32                      entryCount;
		   0u,                                          // VkQueryPipelineStatisticFlags pipelineStatistics;
		};

		m_queryPool = createQueryPool(vk, vkDevice, &queryPoolParams);
	}

	// Create command pool
	m_cmdPool = createCommandPool(vk, vkDevice, VK_COMMAND_POOL_CREATE_TRANSIENT_BIT, queueFamilyIndex);

	// Create command buffer
	m_cmdBuffer = allocateCommandBuffer(vk, vkDevice, *m_cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY);

	// Create fence
	{
		const VkFenceCreateInfo fenceParams =
		{
			VK_STRUCTURE_TYPE_FENCE_CREATE_INFO,        // VkStructureType      sType;
			DE_NULL,                                    // const void*          pNext;
			0u,                                         // VkFenceCreateFlags   flags;
		};

		m_fence = createFence(vk, vkDevice, &fenceParams);
	}

	// alloc timestamp values
	m_timestampValues = new deUint64[m_stages.size()];
}